

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::AcceptConnection(CConnman *this,ListenSocket *hListenSocket)

{
  long lVar1;
  element_type *peVar2;
  bool bVar3;
  int *piVar4;
  Logger *this_00;
  pointer *__ptr;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock;
  socklen_t len;
  direct_or_indirect local_1a8;
  uint local_198;
  direct_or_indirect local_170;
  uint local_160;
  Network local_158;
  uint32_t uStack_154;
  uint16_t local_150;
  direct_or_indirect local_148;
  uint local_138;
  Network local_130;
  uint32_t uStack_12c;
  uint16_t local_128;
  CAddress addr_bind;
  CAddress addr;
  sockaddr_storage sockaddr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  peVar2 = (hListenSocket->sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_Sock[8])(&sock,peVar2,&sockaddr);
  CService::CService(&addr.super_CService);
  addr.nTime.__d.__r = (duration)100000000;
  addr.nServices = NODE_NONE;
  if ((__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
      sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
      super__Head_base<0UL,_Sock_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
    piVar4 = __errno_location();
    if (*piVar4 != 0xb) {
      NetworkErrorString_abi_cxx11_((string *)&addr_bind,*piVar4);
      logging_function._M_str = "AcceptConnection";
      logging_function._M_len = 0x10;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x6ae,ALL,Info,"socket error accept failed: %s\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr_bind);
      if ((size_type *)
          addr_bind.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
          &addr_bind.super_CService.super_CNetAddr.m_addr._size) {
        operator_delete(addr_bind.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
                        indirect,CONCAT44(addr_bind.super_CService.super_CNetAddr.m_addr._20_4_,
                                          addr_bind.super_CService.super_CNetAddr.m_addr._size) + 1)
        ;
      }
    }
  }
  else {
    bVar3 = CService::SetSockAddr(&addr.super_CService,(sockaddr *)&sockaddr);
    if (bVar3) {
      MaybeFlipIPv6toCJDNS((CService *)&local_148.indirect_contents,&addr.super_CService);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_bind,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_148.indirect_contents);
      addr_bind.super_CService.super_CNetAddr.m_net = local_130;
      addr_bind.super_CService.super_CNetAddr.m_scope_id = uStack_12c;
      addr_bind.super_CService.port = local_128;
      addr_bind.nTime.__d.__r = (duration)100000000;
      addr_bind.nServices = NODE_NONE;
      if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
        free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      }
      addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
           addr_bind.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect;
      addr.super_CService.super_CNetAddr.m_addr._union._8_8_ =
           addr_bind.super_CService.super_CNetAddr.m_addr._union._8_8_;
      addr.super_CService.super_CNetAddr.m_addr._size =
           addr_bind.super_CService.super_CNetAddr.m_addr._size;
      addr_bind.super_CService.super_CNetAddr.m_addr._size = 0;
      addr.super_CService.super_CNetAddr.m_net = addr_bind.super_CService.super_CNetAddr.m_net;
      addr.super_CService.super_CNetAddr.m_scope_id =
           addr_bind.super_CService.super_CNetAddr.m_scope_id;
      addr.super_CService.port = addr_bind.super_CService.port;
      addr.nTime = addr_bind.nTime;
      addr.nServices = addr_bind.nServices;
      if (0x10 < local_138) {
        free(local_148.indirect_contents.indirect);
        local_148.indirect_contents.indirect = (char *)0x0;
      }
    }
    else {
      this_00 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Warning);
      if (bVar3) {
        logging_function_00._M_str = "AcceptConnection";
        logging_function_00._M_len = 0x10;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file_00._M_len = 0x50;
        ::LogPrintf_<>(logging_function_00,source_file_00,0x6b4,NET,Warning,
                       "Unknown socket family\n");
      }
    }
    GetBindAddress((CAddress *)&local_1a8.indirect_contents,
                   (Sock *)sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                           super__Head_base<0UL,_Sock_*,_false>._M_head_impl);
    MaybeFlipIPv6toCJDNS
              ((CService *)&local_170.indirect_contents,(CService *)&local_1a8.indirect_contents);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_bind,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_170.indirect_contents);
    addr_bind.super_CService.super_CNetAddr.m_net = local_158;
    addr_bind.super_CService.super_CNetAddr.m_scope_id = uStack_154;
    addr_bind.super_CService.port = local_150;
    addr_bind.nTime.__d.__r = (duration)100000000;
    addr_bind.nServices = NODE_NONE;
    if (0x10 < local_160) {
      free(local_170.indirect_contents.indirect);
      local_170.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < local_198) {
      free(local_1a8.indirect_contents.indirect);
      local_1a8.indirect_contents.indirect = (char *)0x0;
    }
    CreateNodeFromAcceptedSocket(this,&sock,hListenSocket->m_permissions,&addr_bind,&addr);
    if (0x10 < addr_bind.super_CService.super_CNetAddr.m_addr._size) {
      free(addr_bind.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      addr_bind.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0
      ;
    }
  }
  if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
    free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if ((__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)
      sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
      super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
    (**(code **)(*(long *)sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                          super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                          super__Head_base<0UL,_Sock_*,_false>._M_head_impl + 8))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::AcceptConnection(const ListenSocket& hListenSocket) {
    struct sockaddr_storage sockaddr;
    socklen_t len = sizeof(sockaddr);
    auto sock = hListenSocket.sock->Accept((struct sockaddr*)&sockaddr, &len);
    CAddress addr;

    if (!sock) {
        const int nErr = WSAGetLastError();
        if (nErr != WSAEWOULDBLOCK) {
            LogPrintf("socket error accept failed: %s\n", NetworkErrorString(nErr));
        }
        return;
    }

    if (!addr.SetSockAddr((const struct sockaddr*)&sockaddr)) {
        LogPrintLevel(BCLog::NET, BCLog::Level::Warning, "Unknown socket family\n");
    } else {
        addr = CAddress{MaybeFlipIPv6toCJDNS(addr), NODE_NONE};
    }

    const CAddress addr_bind{MaybeFlipIPv6toCJDNS(GetBindAddress(*sock)), NODE_NONE};

    NetPermissionFlags permission_flags = NetPermissionFlags::None;
    hListenSocket.AddSocketPermissionFlags(permission_flags);

    CreateNodeFromAcceptedSocket(std::move(sock), permission_flags, addr_bind, addr);
}